

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<Rational> __thiscall Matrix<Rational>::power(Matrix<Rational> *this,BigInteger *pow)

{
  bool bVar1;
  matrix_error *this_00;
  BigInteger *in_RDX;
  Rational *extraout_RDX;
  Matrix<Rational> *in_RSI;
  BigInteger *in_RDI;
  Matrix<Rational> MVar2;
  BigInteger p;
  Matrix<Rational> a;
  bool t_set;
  Matrix<Rational> t;
  char *in_stack_ffffffffffffff48;
  BigInteger *in_stack_ffffffffffffff50;
  BigInteger *this_01;
  Matrix<Rational> *in_stack_ffffffffffffff70;
  Matrix<Rational> *in_stack_ffffffffffffff78;
  Matrix<Rational> *in_stack_ffffffffffffff80;
  Matrix<Rational> *in_stack_ffffffffffffff88;
  undefined1 local_70 [16];
  BigInteger *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar3;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  
  if (in_RSI->M == in_RSI->N) {
    this_01 = in_RDI;
    width(in_RSI);
    identity(in_stack_ffffffffffffffcc);
    bVar3 = 0;
    Matrix(in_stack_ffffffffffffff70,in_RSI);
    abs((int)local_70);
    while (bVar1 = BigInteger::operator_cast_to_bool((BigInteger *)0x159009), bVar1) {
      bVar1 = BigInteger::odd(in_stack_ffffffffffffff50);
      if (bVar1) {
        if ((bVar3 & 1) == 0) {
          operator=((Matrix<Rational> *)
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (Matrix<Rational> *)CONCAT17(bVar3,in_stack_ffffffffffffffc0));
        }
        else {
          operator*=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        bVar3 = 1;
      }
      BigInteger::_divide_by_2(in_stack_ffffffffffffffa0);
      bVar1 = BigInteger::operator_cast_to_bool((BigInteger *)0x1590a0);
      if (bVar1) {
        operator*=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
    BigInteger::BigInteger(this_01,(longlong)in_RDI);
    bVar1 = operator<(in_stack_ffffffffffffff50,in_RDX);
    if (bVar1) {
      inverted(in_stack_ffffffffffffff88);
    }
    else {
      Matrix(in_stack_ffffffffffffff70,in_RSI);
    }
    BigInteger::~BigInteger((BigInteger *)0x159120);
    BigInteger::~BigInteger((BigInteger *)0x15912a);
    ~Matrix((Matrix<Rational> *)this_01);
    ~Matrix((Matrix<Rational> *)this_01);
    MVar2.arr = extraout_RDX;
    MVar2._0_8_ = this_01;
    return MVar2;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,in_stack_ffffffffffffff48);
  __cxa_throw(this_00,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::power(const BigInteger &pow) const
{
    if(M != N)
        throw matrix_error("Power is only defined for square matrices");
    Matrix t = identity(width());
    bool t_set = false;
    Matrix a(*this);
    BigInteger p = abs(pow);
    while(p)
    {
        if(p.odd())
        {
            if(t_set)
                t *= a;
            else
                t = a;
            t_set = true;
        }
        p._divide_by_2();
        if(p)
            a *= a;
    }
    return pow < 0 ? t.inverted() : t;
}